

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_colorf nk_color_cf(nk_color in)

{
  undefined1 auStack_18 [4];
  nk_color in_local;
  nk_colorf o;
  
  nk_color_f((float *)auStack_18,(float *)&in_local,&o.r,&o.g,in);
  return _auStack_18;
}

Assistant:

NK_API struct nk_colorf
nk_color_cf(struct nk_color in)
{
    struct nk_colorf o;
    nk_color_f(&o.r, &o.g, &o.b, &o.a, in);
    return o;
}